

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O1

void compile_assert_backtrackingpath(compiler_common *common,backtrack_common *current)

{
  PCRE2_UCHAR16 PVar1;
  short sVar2;
  int iVar3;
  PCRE2_SPTR16 pPVar4;
  sljit_compiler *compiler;
  backtrack_common *pbVar5;
  sljit_u8 *psVar6;
  sljit_label *psVar7;
  sljit_jump *psVar8;
  jump_list *pjVar9;
  ulong uVar10;
  sljit_jump *local_38;
  
  pPVar4 = current->cc;
  PVar1 = *pPVar4;
  compiler = common->compiler;
  if ((PVar1 == 0x93) && (compiler->error == 0)) {
    compiler->mode32 = 0;
    psVar6 = emit_x86_instruction(compiler,1,2,0,0x8c,0);
    if (psVar6 != (sljit_u8 *)0x0) {
      *psVar6 = 0x8b;
    }
  }
  if (*(int *)&current[1].nextbacktracks < 0) {
    pjVar9 = current->topbacktracks;
    psVar7 = sljit_emit_label(compiler);
    for (; pjVar9 != (jump_list *)0x0; pjVar9 = pjVar9->next) {
      if ((psVar7 != (sljit_label *)0x0) && (psVar8 = pjVar9->jump, psVar8 != (sljit_jump *)0x0)) {
        psVar8->flags = (psVar8->flags & 0xfffffffffffffffcU) + 1;
        (psVar8->u).label = psVar7;
      }
    }
    if (PVar1 != 0x93) {
      return;
    }
LAB_001159bf:
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar6 = emit_x86_instruction(compiler,1,0x40,0,0x8c,0);
      if (psVar6 != (sljit_u8 *)0x0) {
        *psVar6 = 199;
      }
    }
    psVar8 = sljit_emit_cmp(compiler,1,2,0,0x40,0);
    if ((psVar8 != (sljit_jump *)0x0) &&
       (pbVar5 = current[1].top, pbVar5 != (backtrack_common *)0x0)) {
      psVar8->flags = (psVar8->flags & 0xfffffffffffffffcU) + 1;
      (psVar8->u).target = (sljit_uw)pbVar5;
    }
    sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,8);
  }
  else {
    uVar10 = (ulong)((uint)(PVar1 == 0x93) * 2);
    if (PVar1 == 0x93) {
      sVar2 = *(short *)((long)pPVar4 + uVar10);
      if ((sVar2 == 0x81) || (sVar2 == 0x7f)) goto LAB_001159bf;
      sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,8);
      local_38 = sljit_emit_cmp(compiler,0,2,0,0x40,0);
    }
    else {
      local_38 = (sljit_jump *)0x0;
    }
    sVar2 = *(short *)((long)pPVar4 + uVar10);
    if ((sVar2 == 0x80) || (sVar2 == 0x7e)) {
      if (compiler->error == 0) {
        iVar3 = *(int *)((long)&current[1].nextbacktracks + 4);
        compiler->mode32 = 0;
        psVar6 = emit_x86_instruction(compiler,1,0xc,0,0x8e,(long)iVar3);
        if (psVar6 != (sljit_u8 *)0x0) {
          *psVar6 = 0x8b;
        }
      }
      psVar8 = sljit_emit_jump(compiler,0x19);
      if (compiler->error == 0) {
        pjVar9 = (jump_list *)ensure_abuf(compiler,0x10);
      }
      else {
        pjVar9 = (jump_list *)0x0;
      }
      if (pjVar9 != (jump_list *)0x0) {
        pjVar9->next = common->revertframes;
        pjVar9->jump = psVar8;
        common->revertframes = pjVar9;
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        psVar6 = emit_x86_instruction(compiler,1,1,0,0x8c,-0x10);
        if (psVar6 != (sljit_u8 *)0x0) {
          *psVar6 = 0x8b;
        }
      }
      sljit_emit_op2(compiler,0x60,0xc,0,0xc,0,0x40,
                     (long)*(int *)&current[1].nextbacktracks * 8 + -8);
      if (compiler->error == 0) {
        iVar3 = *(int *)((long)&current[1].nextbacktracks + 4);
        compiler->mode32 = 0;
        psVar6 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar3);
        if (psVar6 != (sljit_u8 *)0x0) {
          *psVar6 = 0x89;
        }
      }
      pjVar9 = current->topbacktracks;
      psVar7 = sljit_emit_label(compiler);
      for (; pjVar9 != (jump_list *)0x0; pjVar9 = pjVar9->next) {
        if ((psVar7 != (sljit_label *)0x0) && (psVar8 = pjVar9->jump, psVar8 != (sljit_jump *)0x0))
        {
          psVar8->flags = (psVar8->flags & 0xfffffffffffffffcU) + 1;
          (psVar8->u).label = psVar7;
        }
      }
    }
    else {
      pjVar9 = current->topbacktracks;
      psVar7 = sljit_emit_label(compiler);
      for (; pjVar9 != (jump_list *)0x0; pjVar9 = pjVar9->next) {
        if ((psVar7 != (sljit_label *)0x0) && (psVar8 = pjVar9->jump, psVar8 != (sljit_jump *)0x0))
        {
          psVar8->flags = (psVar8->flags & 0xfffffffffffffffcU) + 1;
          (psVar8->u).label = psVar7;
        }
      }
    }
    if (PVar1 == 0x93) {
      sljit_emit_op2(compiler,0x62,0xc,0,0xc,0,0x40,8);
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        psVar6 = emit_x86_instruction(compiler,1,0x40,0,0x8c,0);
        if (psVar6 != (sljit_u8 *)0x0) {
          *psVar6 = 199;
        }
      }
      psVar8 = sljit_emit_jump(compiler,0x18);
      if ((psVar8 != (sljit_jump *)0x0) &&
         (pbVar5 = current[1].top, pbVar5 != (backtrack_common *)0x0)) {
        psVar8->flags = (psVar8->flags & 0xfffffffffffffffcU) + 1;
        (psVar8->u).target = (sljit_uw)pbVar5;
      }
      psVar7 = sljit_emit_label(compiler);
      if ((local_38 != (sljit_jump *)0x0) && (psVar7 != (sljit_label *)0x0)) {
        local_38->flags = (local_38->flags & 0xfffffffffffffffcU) + 1;
        (local_38->u).label = psVar7;
      }
    }
  }
  return;
}

Assistant:

static void compile_assert_backtrackingpath(compiler_common *common, struct backtrack_common *current)
{
DEFINE_COMPILER;
PCRE2_SPTR cc = current->cc;
PCRE2_UCHAR bra = OP_BRA;
struct sljit_jump *brajump = NULL;

SLJIT_ASSERT(*cc != OP_BRAMINZERO);
if (*cc == OP_BRAZERO)
  {
  bra = *cc;
  cc++;
  }

if (bra == OP_BRAZERO)
  {
  SLJIT_ASSERT(current->topbacktracks == NULL);
  OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
  }

if (CURRENT_AS(assert_backtrack)->framesize < 0)
  {
  set_jumps(current->topbacktracks, LABEL());

  if (bra == OP_BRAZERO)
    {
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
    CMPTO(SLJIT_NOT_EQUAL, STR_PTR, 0, SLJIT_IMM, 0, CURRENT_AS(assert_backtrack)->matchingpath);
    free_stack(common, 1);
    }
  return;
  }

if (bra == OP_BRAZERO)
  {
  if (*cc == OP_ASSERT_NOT || *cc == OP_ASSERTBACK_NOT)
    {
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
    CMPTO(SLJIT_NOT_EQUAL, STR_PTR, 0, SLJIT_IMM, 0, CURRENT_AS(assert_backtrack)->matchingpath);
    free_stack(common, 1);
    return;
    }
  free_stack(common, 1);
  brajump = CMP(SLJIT_EQUAL, STR_PTR, 0, SLJIT_IMM, 0);
  }

if (*cc == OP_ASSERT || *cc == OP_ASSERTBACK)
  {
  OP1(SLJIT_MOV, STACK_TOP, 0, SLJIT_MEM1(SLJIT_SP), CURRENT_AS(assert_backtrack)->private_data_ptr);
  add_jump(compiler, &common->revertframes, JUMP(SLJIT_FAST_CALL));
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(-2));
  OP2(SLJIT_ADD, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, (CURRENT_AS(assert_backtrack)->framesize - 1) * sizeof(sljit_sw));
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), CURRENT_AS(assert_backtrack)->private_data_ptr, TMP1, 0);

  set_jumps(current->topbacktracks, LABEL());
  }
else
  set_jumps(current->topbacktracks, LABEL());

if (bra == OP_BRAZERO)
  {
  /* We know there is enough place on the stack. */
  OP2(SLJIT_SUB, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, sizeof(sljit_sw));
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
  JUMPTO(SLJIT_JUMP, CURRENT_AS(assert_backtrack)->matchingpath);
  JUMPHERE(brajump);
  }
}